

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O0

boolean mk_split_room(level *lev)

{
  char cVar1;
  char cVar2;
  xchar xVar3;
  xchar xVar4;
  boolean bVar5;
  schar sVar6;
  int iVar7;
  int b;
  bool bVar8;
  char local_80;
  char local_78;
  int local_70;
  int local_68;
  int adj_1;
  int adj;
  int broom;
  int aroom;
  char local_44;
  xchar by2;
  xchar bx2;
  xchar by1;
  xchar bx1;
  xchar ay2;
  xchar ax2;
  xchar ay1;
  xchar ax1;
  xchar rlit;
  xchar height;
  xchar width;
  xchar ly;
  xchar lx;
  int ryspace;
  int rxspace;
  int mbottom;
  int mright;
  int mtop;
  int mleft;
  nhrect r2;
  nhrect *r1;
  level *lev_local;
  
  _mleft = rnd_rect();
  if (_mleft == (nhrect *)0x0) {
    lev_local._7_1_ = '\0';
  }
  else {
    mright = 3;
    if ('\0' < _mleft->lx) {
      mright = 4;
    }
    mbottom = 2;
    if ('\0' < _mleft->ly) {
      mbottom = 3;
    }
    bVar8 = false;
    if ('\0' < _mleft->lx) {
      bVar8 = _mleft->hx < 'O';
    }
    rxspace = 5;
    if (bVar8) {
      rxspace = 8;
    }
    bVar8 = false;
    if ('\0' < _mleft->ly) {
      bVar8 = _mleft->hy < '\x14';
    }
    ryspace = 4;
    if (bVar8) {
      ryspace = 6;
    }
    iVar7 = rn2(8);
    by1 = (char)iVar7 + '\x05';
    iVar7 = rn2(2);
    bx2 = (char)iVar7 + '\x05';
    if (_mleft->lx < '\x01') {
      local_68 = 3;
    }
    else {
      local_68 = (int)_mleft->lx;
    }
    _height = (((_mleft->hx - local_68) - (int)by1) - rxspace) + 1;
    if (_mleft->ly < '\x01') {
      local_70 = 2;
    }
    else {
      local_70 = (int)_mleft->ly;
    }
    _ax2 = (((_mleft->hy - local_70) - (int)bx2) - ryspace) + 1;
    if ((_height < 0) || (_ax2 < 0)) {
      lev_local._7_1_ = '\0';
    }
    else {
      cVar1 = _mleft->lx;
      cVar2 = (char)mright;
      if (_height == 0) {
        local_78 = '\0';
      }
      else {
        iVar7 = rn2(_height);
        local_78 = (char)iVar7;
      }
      ay2 = cVar1 + cVar2 + local_78;
      cVar1 = _mleft->ly;
      cVar2 = (char)mbottom;
      if (_ax2 == 0) {
        local_80 = '\0';
      }
      else {
        iVar7 = rn2(_ax2);
        local_80 = (char)iVar7;
      }
      bx1 = cVar1 + cVar2 + local_80;
      bVar5 = check_room(lev,&ay2,&by1,&bx1,&bx2,'\0');
      if (bVar5 == '\0') {
        lev_local._7_1_ = '\0';
      }
      else if ((by1 < '\x05') || (bx2 < '\x05')) {
        lev_local._7_1_ = '\0';
      }
      else {
        mtop._0_1_ = ay2 + -1;
        mtop._1_1_ = bx1 + -1;
        mtop._2_1_ = ay2 + by1 + '\x01';
        mtop._3_1_ = bx1 + bx2 + '\x01';
        split_rects(_mleft,(nhrect *)&mtop);
        xVar4 = ay2;
        xVar3 = bx1;
        iVar7 = rnf((int)by1,(int)by1 + (int)bx2);
        if (iVar7 == 0) {
          cVar1 = bx2 / '\x02';
          local_44 = ay2 + by1;
          aroom._3_1_ = bx1 + cVar1 + -1;
          aroom._2_1_ = ay2;
          aroom._1_1_ = bx1 + cVar1 + '\x01';
          cVar1 = cVar1 * '\x02';
          cVar2 = by1;
        }
        else {
          cVar2 = by1 / '\x02';
          local_44 = ay2 + cVar2 + -1;
          aroom._3_1_ = bx1 + bx2;
          aroom._2_1_ = ay2 + cVar2 + '\x01';
          aroom._1_1_ = bx1;
          cVar1 = bx2;
          cVar2 = cVar2 * '\x02';
        }
        aroom._0_1_ = ay2 + cVar2;
        broom._3_1_ = bx1 + cVar1;
        sVar6 = depth(&lev->z);
        iVar7 = (int)sVar6;
        if (iVar7 < 1) {
          iVar7 = -iVar7;
        }
        iVar7 = rnd(iVar7 + 1);
        bVar8 = false;
        if (iVar7 < 0xb) {
          iVar7 = rn2(0x4d);
          bVar8 = iVar7 != 0;
        }
        add_room(lev,(int)xVar4,(int)xVar3,(int)local_44,(int)aroom._3_1_,bVar8,'\0','\0');
        iVar7 = lev->nroom + -1;
        smeq[iVar7] = iVar7;
        add_room(lev,(int)aroom._2_1_,(int)aroom._1_1_,(int)(char)aroom,(int)broom._3_1_,bVar8,'\0',
                 '\0');
        b = lev->nroom + -1;
        smeq[b] = b;
        join(lev,iVar7,b,'\0');
        lev_local._7_1_ = '\x01';
      }
    }
  }
  return lev_local._7_1_;
}

Assistant:

static boolean mk_split_room(struct level *lev)
{
	struct nhrect *r1 = rnd_rect();
	struct nhrect r2;
	int mleft, mtop, mright, mbottom;
	int rxspace, ryspace;
	xchar lx, ly, width, height;
	xchar rlit;
	xchar ax1, ay1, ax2, ay2, bx1, by1, bx2, by2;
	int aroom, broom;

	if (!r1)
	    return FALSE;

	/* Try to mimic create_room()'s border/margin calculations. */
	mleft = r1->lx > 0 ? XLIM : 3;
	mtop = r1->ly > 0 ? YLIM : 2;
	mright = (r1->lx > 0 && r1->hx < COLNO - 1) ? 2 * XLIM : XLIM + 1;
	mbottom = (r1->ly > 0 && r1->hy < ROWNO - 1) ? 2 * YLIM : YLIM + 1;

	width = rn1(8, 5);
	height = rn1(2, 5);
	rxspace = r1->hx - (r1->lx > 0 ? r1->lx : 3) - width - mright + 1;
	ryspace = r1->hy - (r1->ly > 0 ? r1->ly : 2) - height - mbottom + 1;

	if (rxspace < 0 || ryspace < 0)
	    return FALSE;

	lx = r1->lx + mleft + (rxspace ? rn2(rxspace) : 0);
	ly = r1->ly + mtop + (ryspace ? rn2(ryspace) : 0);

	if (!check_room(lev, &lx, &width, &ly, &height, FALSE))
	    return FALSE;
	if (width < 5 || height < 5)
	    return FALSE;

	r2.lx = lx - 1;
	r2.ly = ly - 1;
	r2.hx = lx + width + 1;
	r2.hy = ly + height + 1;
	split_rects(r1, &r2);

	ax1 = lx;
	ay1 = ly;
	if (rnf(width, width + height)) {
	    int adj = width / 2;
	    ax2 = lx + adj - 1;
	    ay2 = ly + height;
	    bx1 = lx + adj + 1;
	    by1 = ly;
	    bx2 = lx + adj + adj;
	    by2 = ly + height;
	} else {
	    int adj = height / 2;
	    ax2 = lx + width;
	    ay2 = ly + adj - 1;
	    bx1 = lx;
	    by1 = ly + adj + 1;
	    bx2 = lx + width;
	    by2 = ly + adj + adj;
	}

	rlit = (rnd(1+abs(depth(&lev->z))) < 11 && rn2(77)) ? TRUE : FALSE;

	add_room(lev, ax1, ay1, ax2, ay2, rlit, OROOM, FALSE);
	aroom = lev->nroom - 1;
	smeq[aroom] = aroom;

	add_room(lev, bx1, by1, bx2, by2, rlit, OROOM, FALSE);
	broom = lev->nroom - 1;
	smeq[broom] = broom;

	join(lev, aroom, broom, FALSE);

	return TRUE;
}